

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clientversion.cpp
# Opt level: O0

string * FormatFullVersion_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  allocator<char> local_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  __str = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           (in_FS_OFFSET + 0x28);
  if (FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_00000008,(char *)unaff_retaddr,(allocator<char> *)__str);
      std::allocator<char>::~allocator(&local_9);
      __cxa_atexit(std::__cxx11::string::~string,
                   &FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_);
    }
  }
  std::__cxx11::string::string(unaff_retaddr,__str);
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      == __str) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatFullVersion()
{
    static const std::string CLIENT_BUILD(BUILD_DESC BUILD_SUFFIX);
    return CLIENT_BUILD;
}